

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O2

char * pm_slashskip(char *s)

{
  for (; (*s == '/' || ((*s == '.' && ((s[1] == '/' || (s[1] == '\0')))))); s = s + 1) {
  }
  return s;
}

Assistant:

static const char *
pm_slashskip(const char *s) {
	while ((*s == '/')
	    || (s[0] == '.' && s[1] == '/')
	    || (s[0] == '.' && s[1] == '\0'))
		++s;
	return (s);
}